

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

void __thiscall amrex::VisMF::VisMF(VisMF *this,string *fafab_name)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  Long LVar4;
  FArrayBox **ppFVar5;
  string *in_RSI;
  string *in_RDI;
  MPI_Comm *in_stack_00000048;
  int N;
  int ii;
  int n;
  istringstream infs;
  string fileCharPtrString;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  string FullHdrFileName;
  size_type in_stack_fffffffffffffd98;
  Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *in_stack_fffffffffffffda0;
  allocator *__new_size;
  vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *this_00;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  int iVar6;
  undefined4 in_stack_fffffffffffffdf4;
  int iVar7;
  istringstream local_208 [391];
  allocator local_81;
  string local_80 [36];
  MPI_Comm local_5c;
  vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> local_58;
  string local_40 [64];
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  Header::Header((Header *)(in_RDI + 0x20));
  Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ::Vector((Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
            *)0xf80e04);
  std::__cxx11::string::string(local_40,in_RDI);
  std::__cxx11::string::operator+=(local_40,TheMultiFabHdrFileSuffix);
  this_00 = &local_58;
  Vector<char,_std::allocator<char>_>::Vector((Vector<char,_std::allocator<char>_> *)0xf80e40);
  local_5c = ParallelDescriptor::Communicator();
  ParallelDescriptor::ReadAndBcastFile(_infs,_ii,N._3_1_,in_stack_00000048);
  pcVar2 = Vector<char,_std::allocator<char>_>::dataPtr
                     ((Vector<char,_std::allocator<char>_> *)0xf80e7a);
  __new_size = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,pcVar2,__new_size);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::istringstream::istringstream(local_208,local_80,_S_in);
  amrex::operator>>((istream *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                    (Header *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  std::
  vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ::resize((vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
            *)this_00,(size_type)__new_size);
  iVar7 = 0;
  while( true ) {
    lVar3 = (long)iVar7;
    LVar4 = Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
            ::size((Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                    *)0xf80f22);
    if (LVar4 <= lVar3) break;
    in_stack_fffffffffffffda0 =
         Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
         ::operator[]((Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                       *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    BoxArray::size((BoxArray *)0xf80f5c);
    std::vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>::resize
              (this_00,(size_type)__new_size);
    iVar6 = 0;
    Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                  *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    LVar4 = Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>::size
                      ((Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *)0xf80f91);
    iVar1 = (int)LVar4;
    for (; iVar6 < iVar1; iVar6 = iVar6 + 1) {
      Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                    *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      ppFVar5 = Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>::operator[]
                          (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      *ppFVar5 = (FArrayBox *)0x0;
    }
    iVar7 = iVar7 + 1;
  }
  std::__cxx11::istringstream::~istringstream(local_208);
  std::__cxx11::string::~string(local_80);
  Vector<char,_std::allocator<char>_>::~Vector((Vector<char,_std::allocator<char>_> *)0xf810d0);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

VisMF::VisMF (const std::string &fafab_name)
    :
    m_fafabname(fafab_name)
{
    std::string FullHdrFileName(m_fafabname);

    FullHdrFileName += TheMultiFabHdrFileSuffix;

    Vector<char> fileCharPtr;
    ParallelDescriptor::ReadAndBcastFile(FullHdrFileName, fileCharPtr);
    std::string fileCharPtrString(fileCharPtr.dataPtr());
    std::istringstream infs(fileCharPtrString, std::istringstream::in);

    infs >> m_hdr;

    m_pa.resize(m_hdr.m_ncomp);

    for(int n(0); n < m_pa.size(); ++n) {
        m_pa[n].resize(m_hdr.m_ba.size());

        for(int ii(0), N(m_pa[n].size()); ii < N; ++ii) {
            m_pa[n][ii] = 0;
        }
    }
}